

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O3

string * __thiscall
iqxmlrpc::http::Header::dump_abi_cxx11_(string *__return_storage_ptr__,Header *this)

{
  long *plVar1;
  _Base_ptr p_Var2;
  long *plVar3;
  _Rb_tree_header *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_90;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  (*this->_vptr_Header[2])();
  p_Var2 = (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->options_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,*(long *)(p_Var2 + 1),
                 (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
      std::__cxx11::string::append((char *)local_50);
      plVar1 = (long *)std::__cxx11::string::_M_append((char *)local_50,*(ulong *)(p_Var2 + 2));
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_60 = *plVar3;
        lStack_58 = plVar1[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar3;
        local_70 = (long *)*plVar1;
      }
      local_68 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_80 = *plVar3;
        lStack_78 = plVar1[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar3;
        local_90 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Header::dump() const
{
  std::string retval = dump_head();

  for (Options::const_iterator i = options_.begin(); i != options_.end(); ++i) {
    retval += i->first + ": " + i->second + names::crlf;
  }

  retval += names::crlf;
  return retval;
}